

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O1

void test4(void)

{
  return;
}

Assistant:

void test4()
{
	varchar<10> lhs = "test";
	varchar<11> rhs = "hello";
	assert(lhs != rhs);
	assert(rhs != lhs);
	assert(!(lhs == rhs));
	assert(!(rhs == lhs));
}